

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O0

void __thiscall Fl_File_Chooser::preview(Fl_File_Chooser *this,int e)

{
  Fl_File_Browser *pFVar1;
  Fl_Box *pFVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Fl_Group *pFVar8;
  uint uVar9;
  int w;
  Fl_Group *p;
  int e_local;
  Fl_File_Chooser *this_local;
  
  Fl_Button::value((Fl_Button *)this->previewButton,e);
  Fl_Preferences::set(prefs_,"preview",e);
  Fl_Preferences::flush(prefs_);
  pFVar8 = Fl_Widget::parent(&this->previewBox->super_Fl_Widget);
  if (e == 0) {
    pFVar1 = this->fileList;
    uVar4 = Fl_Widget::x((Fl_Widget *)this->fileList);
    uVar5 = Fl_Widget::y((Fl_Widget *)this->fileList);
    uVar6 = Fl_Widget::w(&pFVar8->super_Fl_Widget);
    uVar9 = Fl_Widget::h((Fl_Widget *)this->fileList);
    (*(pFVar1->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[4]
    )(pFVar1,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar9);
    pFVar2 = this->previewBox;
    iVar3 = Fl_Widget::x(&pFVar8->super_Fl_Widget);
    iVar7 = Fl_Widget::w(&pFVar8->super_Fl_Widget);
    uVar4 = Fl_Widget::y(&this->previewBox->super_Fl_Widget);
    uVar5 = Fl_Widget::h(&this->previewBox->super_Fl_Widget);
    (*(pFVar2->super_Fl_Widget)._vptr_Fl_Widget[4])
              (pFVar2,(ulong)(uint)(iVar3 + iVar7),(ulong)uVar4,0,(ulong)uVar5);
    (*(this->previewBox->super_Fl_Widget)._vptr_Fl_Widget[6])();
  }
  else {
    iVar3 = Fl_Widget::w(&pFVar8->super_Fl_Widget);
    uVar9 = (iVar3 << 1) / 3;
    pFVar1 = this->fileList;
    uVar4 = Fl_Widget::x((Fl_Widget *)this->fileList);
    uVar5 = Fl_Widget::y((Fl_Widget *)this->fileList);
    uVar6 = Fl_Widget::h((Fl_Widget *)this->fileList);
    (*(pFVar1->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[4]
    )(pFVar1,(ulong)uVar4,(ulong)uVar5,(ulong)uVar9,(ulong)uVar6);
    pFVar2 = this->previewBox;
    iVar3 = Fl_Widget::x((Fl_Widget *)this->fileList);
    uVar4 = Fl_Widget::y(&this->previewBox->super_Fl_Widget);
    iVar7 = Fl_Widget::w(&pFVar8->super_Fl_Widget);
    uVar5 = Fl_Widget::h(&this->previewBox->super_Fl_Widget);
    (*(pFVar2->super_Fl_Widget)._vptr_Fl_Widget[4])
              (pFVar2,(ulong)(iVar3 + uVar9),(ulong)uVar4,(ulong)(iVar7 - uVar9),(ulong)uVar5);
    (*(this->previewBox->super_Fl_Widget)._vptr_Fl_Widget[5])();
    update_preview(this);
  }
  Fl_Group::init_sizes(pFVar8);
  pFVar8 = Fl_Widget::parent((Fl_Widget *)this->fileList);
  Fl_Widget::redraw(&pFVar8->super_Fl_Widget);
  return;
}

Assistant:

void Fl_File_Chooser::preview(int e)
{
  previewButton->value(e);
  prefs_->set("preview", e);
  prefs_->flush();

  Fl_Group *p = previewBox->parent();
  if (e) {
    int w = p->w() * 2 / 3;
    fileList->resize(fileList->x(), fileList->y(),
                     w, fileList->h());
    previewBox->resize(fileList->x()+w, previewBox->y(),
                       p->w()-w, previewBox->h());
    previewBox->show();
    update_preview();
  } else {
    fileList->resize(fileList->x(), fileList->y(),
                     p->w(), fileList->h());
    previewBox->resize(p->x()+p->w(), previewBox->y(),
                       0, previewBox->h());
    previewBox->hide();
  }
  p->init_sizes();

  fileList->parent()->redraw();
}